

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

uint64_t aom_mse_16xh_16bit_avx2(uint8_t *dst,int dstride,uint16_t *src,int w,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  long lVar11;
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  
  if (w == 8) {
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    for (lVar11 = 0; auVar13 = auVar14._0_32_, lVar11 < h; lVar11 = lVar11 + 2) {
      auVar3 = vpmovzxbw_avx2(*(undefined1 (*) [16])dst);
      auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dstride));
      auVar5 = vperm2i128_avx2(*(undefined1 (*) [32])src,
                               *(undefined1 (*) [32])(*(undefined1 (*) [32])src + (long)(h * 8) * 2)
                               ,0x20);
      auVar3 = vpsubw_avx2(auVar5,auVar3);
      auVar5 = vperm2i128_avx2(*(undefined1 (*) [32])src,
                               *(undefined1 (*) [32])(*(undefined1 (*) [32])src + (long)(h * 8) * 2)
                               ,0x31);
      auVar4 = vpsubw_avx2(auVar5,auVar4);
      auVar3 = vpabsw_avx2(auVar3);
      auVar4 = vpabsw_avx2(auVar4);
      auVar3 = vpmaddwd_avx2(auVar3,auVar3);
      auVar4 = vpmaddwd_avx2(auVar4,auVar4);
      auVar13 = vpaddd_avx2(auVar3,auVar13);
      auVar13 = vpaddd_avx2(auVar13,auVar4);
      auVar14 = ZEXT3264(auVar13);
      src = (uint16_t *)((long)src + 0x20);
      dst = *(undefined1 (*) [16])dst + (long)dstride * 2;
    }
  }
  else {
    if (w != 4) {
      return 0xffffffffffffffff;
    }
    lVar11 = (long)dstride;
    auVar14 = ZEXT1664((undefined1  [16])0x0);
    for (lVar12 = 0; auVar13 = auVar14._0_32_, lVar12 < h; lVar12 = lVar12 + 4) {
      auVar3 = vpmovzxbw_avx2(*(undefined1 (*) [16])dst);
      auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])dst + lVar11));
      auVar5 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])dst + lVar11 * 2));
      auVar6 = vpmovzxbw_avx2(*(undefined1 (*) [16])(*(undefined1 (*) [16])dst + lVar11 * 3));
      auVar9 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(src + lVar12 * 4),
                                *(undefined1 (*) [32])(src + (long)(h * 4) + lVar12 * 4));
      auVar7 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(src + lVar12 * 4),
                                *(undefined1 (*) [32])(src + (long)(h * 4) + lVar12 * 4));
      auVar10 = vpunpcklqdq_avx2(*(undefined1 (*) [32])(src + (long)(h * 8) + lVar12 * 4),
                                 *(undefined1 (*) [32])(src + (long)(h * 0xc) + lVar12 * 4));
      auVar8 = vpunpckhqdq_avx2(*(undefined1 (*) [32])(src + (long)(h * 8) + lVar12 * 4),
                                *(undefined1 (*) [32])(src + (long)(h * 0xc) + lVar12 * 4));
      auVar15._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar9._0_16_;
      auVar15._16_16_ = ZEXT116(0) * auVar9._16_16_ + ZEXT116(1) * auVar10._0_16_;
      auVar3 = vpsubw_avx2(auVar15,auVar3);
      auVar16._0_16_ = ZEXT116(0) * auVar8._0_16_ + ZEXT116(1) * auVar7._0_16_;
      auVar16._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar8._0_16_;
      auVar4 = vpsubw_avx2(auVar16,auVar4);
      auVar9 = vperm2i128_avx2(auVar9,auVar10,0x31);
      auVar5 = vpsubw_avx2(auVar9,auVar5);
      auVar7 = vperm2i128_avx2(auVar7,auVar8,0x31);
      auVar6 = vpsubw_avx2(auVar7,auVar6);
      auVar3 = vpabsw_avx2(auVar3);
      auVar4 = vpabsw_avx2(auVar4);
      auVar5 = vpabsw_avx2(auVar5);
      auVar6 = vpabsw_avx2(auVar6);
      auVar7 = vpmaddwd_avx2(auVar3,auVar3);
      auVar3 = vpmaddwd_avx2(auVar4,auVar4);
      auVar4 = vpmaddwd_avx2(auVar5,auVar5);
      auVar3 = vpaddd_avx2(auVar3,auVar4);
      auVar4 = vpmaddwd_avx2(auVar6,auVar6);
      auVar13 = vpaddd_avx2(auVar7,auVar13);
      auVar13 = vpaddd_avx2(auVar13,auVar3);
      auVar13 = vpaddd_avx2(auVar13,auVar4);
      auVar14 = ZEXT3264(auVar13);
      dst = *(undefined1 (*) [16])dst + lVar11 * 4;
    }
  }
  auVar3 = vpunpckldq_avx2(auVar13,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  auVar13 = vpunpckhdq_avx2(auVar13,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  auVar13 = vpaddq_avx2(auVar3,auVar13);
  auVar1 = vpaddq_avx(auVar13._0_16_,auVar13._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddq_avx(auVar1,auVar2);
  return auVar1._0_8_;
}

Assistant:

uint64_t aom_mse_16xh_16bit_avx2(uint8_t *dst, int dstride, uint16_t *src,
                                 int w, int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must be satisfied");
  switch (w) {
    case 4: return mse_4xh_quad_16bit_avx2(dst, dstride, src, w * h, h);
    case 8: return mse_8xh_dual_16bit_avx2(dst, dstride, src, w * h, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}